

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O1

void __thiscall
Diligent::GLContextState::SetBlendState
          (GLContextState *this,BlendStateDesc *BSDsc,Uint32 RenderTargetMask,Uint32 SampleMask)

{
  LOGIC_OPERATION *pLVar1;
  byte bVar2;
  LOGIC_OPERATION LVar3;
  GLenum GVar4;
  GLenum GVar5;
  GLenum GVar6;
  uint uVar7;
  char *pcVar8;
  BlendStateDesc *pBVar9;
  char (*pacVar10) [43];
  char (*Args_1) [43];
  char (*pacVar11) [53];
  Uint32 UVar12;
  BlendStateDesc *pBVar13;
  char (*in_R8) [63];
  byte bVar14;
  bool bVar15;
  bool bVar16;
  byte bVar17;
  long lVar18;
  string _msg;
  GLenum err;
  GLenum err_4;
  GLint *in_stack_ffffffffffffff68;
  GLint *Args_4;
  char (*in_stack_ffffffffffffff78) [14];
  string local_80;
  uint local_5c;
  Uint32 local_58;
  int local_54;
  BlendStateDesc *local_50;
  GLint *local_48;
  GLContextState *local_40;
  BlendStateDesc *local_38;
  
  local_58 = RenderTargetMask;
  local_40 = this;
  if (SampleMask != 0xffffffff) {
    FormatString<char[55]>
              (&local_80,(char (*) [55])"Sample mask is not currently implemented in GL backend");
    if (DebugMessageCallback != (undefined *)0x0) {
      in_R8 = (char (*) [63])0x0;
      (*(code *)DebugMessageCallback)(2,local_80._M_dataplus._M_p,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  bVar17 = BSDsc->RenderTargets[0].BlendEnable;
  if (0xff < local_58) {
    FormatString<char[21],unsigned_int,char[63]>
              (&local_80,(Diligent *)"Render target mask (",(char (*) [21])&local_58,
               (uint *)") contains bits that correspond to non-existent render targets",in_R8);
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x2db);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    local_58 = local_58 & 0xff;
  }
  Args_4 = &(local_40->m_Caps).MaxDrawBuffers;
  bVar14 = (byte)(local_40->m_Caps).MaxDrawBuffers;
  pBVar9 = (BlendStateDesc *)CONCAT71((int7)((ulong)Args_4 >> 8),bVar14);
  local_48 = Args_4;
  if (local_58 >> (bVar14 & 0x1f) != 0) {
    if (local_58 == 0) {
      local_5c = 0x20;
    }
    else {
      local_5c = 0;
      if (local_58 != 0) {
        for (; (local_58 >> local_5c & 1) == 0; local_5c = local_5c + 1) {
        }
      }
    }
    pcVar8 = ") contains buffer ";
    FormatString<char[21],unsigned_int,char[19],unsigned_int,char[32],int,char[14]>
              (&local_80,(Diligent *)"Render target mask (",(char (*) [21])&local_58,
               (uint *)") contains buffer ",(char (*) [19])&local_5c,
               (uint *)" but this device only supports ",(char (*) [32])Args_4,
               (int *)" draw buffers",in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff68 = Args_4;
    if (DebugMessageCallback != (undefined *)0x0) {
      pcVar8 = (char *)0x0;
      (*(code *)DebugMessageCallback)(2,local_80._M_dataplus._M_p,0,0,0);
      in_stack_ffffffffffffff68 = Args_4;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    pBVar9 = (BlendStateDesc *)CONCAT71((int7)((ulong)pcVar8 >> 8),(byte)*local_48);
    local_58 = local_58 & ~(-1 << ((byte)*local_48 & 0x1f));
  }
  pBVar13 = (BlendStateDesc *)BSDsc->RenderTargets;
  local_50 = pBVar13;
  local_38 = BSDsc;
  if (local_58 == 0) {
    bVar14 = 0;
    bVar16 = false;
  }
  else {
    bVar14 = 0;
    UVar12 = local_58;
    bVar15 = false;
    do {
      uVar7 = 0;
      if (UVar12 != 0) {
        for (; (UVar12 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
        }
      }
      if ((7 < uVar7) || (*local_48 <= (int)uVar7)) {
        FormatString<char[26],char[72]>
                  (&local_80,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "rt < MAX_RENDER_TARGETS && static_cast<int>(rt) < m_Caps.MaxDrawBuffers",
                   &pBVar9->AlphaToCoverageEnable);
        DebugAssertionFailed
                  (local_80._M_dataplus._M_p,"SetBlendState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x2e9);
        pBVar13 = local_50;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          pBVar13 = local_50;
        }
      }
      if (pBVar13->RenderTargets[uVar7].BlendOpAlpha == BLEND_OPERATION_UNDEFINED) {
        FormatString<char[103]>
                  (&local_80,
                   (char (*) [103])
                   "Render target write mask should not be COLOR_MASK_NONE if corresponding bit is set in RenderTargetMask"
                  );
        DebugAssertionFailed
                  (local_80._M_dataplus._M_p,"SetBlendState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x2ec);
        pBVar13 = local_50;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          pBVar13 = local_50;
        }
      }
      pLVar1 = &pBVar13->RenderTargets[(ulong)uVar7 - 1].LogicOp;
      bVar2 = pLVar1[9];
      bVar16 = true;
      if (bVar14 == bVar2) {
        bVar16 = bVar15;
      }
      if (bVar14 == 0) {
        bVar16 = bVar15;
        bVar14 = bVar2;
      }
      if ((local_38->IndependentBlendEnable == true) && (*pLVar1 != LOGIC_OP_CLEAR)) {
        bVar17 = 1;
      }
      UVar12 = UVar12 & ~(1 << (uVar7 & 0x1f));
      pBVar9 = local_38;
      bVar15 = bVar16;
    } while (UVar12 != 0);
  }
  if (bVar16) {
    if (local_58 != 0) {
      UVar12 = local_58;
      do {
        uVar7 = 0;
        if (UVar12 != 0) {
          for (; (UVar12 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        if ((7 < uVar7) || (*local_48 <= (int)uVar7)) {
          FormatString<char[26],char[72]>
                    (&local_80,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])
                     "rt < MAX_RENDER_TARGETS && static_cast<int>(rt) < m_Caps.MaxDrawBuffers",
                     &pBVar9->AlphaToCoverageEnable);
          DebugAssertionFailed
                    (local_80._M_dataplus._M_p,"SetBlendState",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                     ,0x300);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
        UVar12 = UVar12 & ~(1 << (uVar7 & 0x1f));
        pBVar9 = local_50;
        SetColorWriteMaskIndexed(local_40,uVar7,(uint)local_50->RenderTargets[uVar7].BlendOpAlpha);
      } while (UVar12 != 0);
    }
  }
  else if (bVar14 != 0) {
    SetColorWriteMask(local_40,(uint)bVar14);
  }
  if ((bVar17 & 1) == 0) {
    glDisable();
    local_5c = glGetError();
    if (local_5c == 0) {
      return;
    }
    LogError<false,char[33],char[17],unsigned_int>
              (false,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x354,(char (*) [33])"Failed to disable alpha blending",
               (char (*) [17])"\nGL Error Code: ",&local_5c);
    FormatString<char[6]>(&local_80,(char (*) [6])0x32952e);
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x354);
    goto LAB_0016540d;
  }
  glEnable();
  local_5c = glGetError();
  pBVar13 = local_38;
  if (local_5c != 0) {
    in_stack_ffffffffffffff68 = (GLint *)&local_5c;
    LogError<false,char[32],char[17],unsigned_int>
              (false,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x30e,(char (*) [32])"Failed to enable alpha blending",
               (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_ffffffffffffff68);
    FormatString<char[6]>(&local_80,(char (*) [6])0x32952e);
    pBVar9 = (BlendStateDesc *)0x30e;
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x30e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  if (pBVar13->AlphaToCoverageEnable == true) {
    glEnable();
    local_5c = glGetError();
    if (local_5c != 0) {
      in_stack_ffffffffffffff68 = (GLint *)&local_5c;
      LogError<false,char[35],char[17],unsigned_int>
                (false,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x313,(char (*) [35])"Failed to enable alpha to coverage",
                 (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_ffffffffffffff68);
      FormatString<char[6]>(&local_80,(char (*) [6])0x32952e);
      pBVar9 = (BlendStateDesc *)0x313;
      DebugAssertionFailed
                (local_80._M_dataplus._M_p,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x313);
LAB_00164b2a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    glDisable();
    local_5c = glGetError();
    if (local_5c != 0) {
      in_stack_ffffffffffffff68 = (GLint *)&local_5c;
      LogError<false,char[36],char[17],unsigned_int>
                (false,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x318,(char (*) [36])"Failed to disable alpha to coverage",
                 (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_ffffffffffffff68);
      FormatString<char[6]>(&local_80,(char (*) [6])0x32952e);
      pBVar9 = (BlendStateDesc *)0x318;
      DebugAssertionFailed
                (local_80._M_dataplus._M_p,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x318);
      goto LAB_00164b2a;
    }
  }
  if (pBVar13->IndependentBlendEnable == true) {
    local_5c = 0;
    pBVar9 = local_50;
    do {
      pacVar10 = (char (*) [43])(long)(int)local_5c;
      LVar3 = pBVar9->RenderTargets[(long)(pacVar10[-1] + 0x2a)].LogicOp;
      if ((int)local_5c < *local_48) {
        if (LVar3 == LOGIC_OP_CLEAR) {
          (*__glewDisablei)(0xbe2,local_5c);
          local_54 = glGetError();
          pBVar9 = local_50;
          if (local_54 != 0) {
            in_stack_ffffffffffffff68 = &local_54;
            LogError<false,char[33],char[17],unsigned_int>
                      (false,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x33b,(char (*) [33])"Failed to disable alpha blending",
                       (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_ffffffffffffff68);
            FormatString<char[6]>(&local_80,(char (*) [6])0x32952e);
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x33b);
            goto LAB_00165072;
          }
        }
        else {
          Args_1 = pacVar10;
          (*__glewEnablei)(0xbe2,local_5c);
          local_54 = glGetError();
          if (local_54 != 0) {
            in_stack_ffffffffffffff68 = &local_54;
            LogError<false,char[32],char[17],unsigned_int>
                      (false,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x32b,(char (*) [32])"Failed to enable alpha blending",
                       (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_ffffffffffffff68);
            FormatString<char[6]>(&local_80,(char (*) [6])0x32952e);
            Args_1 = (char (*) [43])0x32b;
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x32b);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          pBVar9 = local_50;
          lVar18 = (long)local_50->RenderTargets[(long)pacVar10].BlendEnable;
          if (0x11 < lVar18) {
            FormatString<char[26],char[43]>
                      (&local_80,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"bf < int{_countof(BlendFactor2GLBlendMap)}",Args_1);
            Args_1 = (char (*) [43])0x183;
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"BlendFactor2GLBlend",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
                       ,0x183);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          GVar4 = *(GLenum *)
                   (BlendFactor2GLBlend(Diligent::BLEND_FACTOR)::BlendFactor2GLBlendMap + lVar18 * 4
                   );
          lVar18 = (long)pBVar9->RenderTargets[(long)pacVar10].LogicOperationEnable;
          if (0x11 < lVar18) {
            FormatString<char[26],char[43]>
                      (&local_80,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"bf < int{_countof(BlendFactor2GLBlendMap)}",Args_1);
            Args_1 = (char (*) [43])0x183;
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"BlendFactor2GLBlend",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
                       ,0x183);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          GVar5 = *(GLenum *)
                   (BlendFactor2GLBlend(Diligent::BLEND_FACTOR)::BlendFactor2GLBlendMap + lVar18 * 4
                   );
          lVar18 = (long)(char)pBVar9->RenderTargets[(long)pacVar10].DestBlend;
          if (0x11 < lVar18) {
            FormatString<char[26],char[43]>
                      (&local_80,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"bf < int{_countof(BlendFactor2GLBlendMap)}",Args_1);
            Args_1 = (char (*) [43])0x183;
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"BlendFactor2GLBlend",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
                       ,0x183);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          uVar7 = *(uint *)(BlendFactor2GLBlend(Diligent::BLEND_FACTOR)::BlendFactor2GLBlendMap +
                           lVar18 * 4);
          lVar18 = (long)(char)pBVar9->RenderTargets[(long)pacVar10].BlendOp;
          if (0x11 < lVar18) {
            FormatString<char[26],char[43]>
                      (&local_80,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"bf < int{_countof(BlendFactor2GLBlendMap)}",Args_1);
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"BlendFactor2GLBlend",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
                       ,0x183);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          pacVar11 = (char (*) [53])(ulong)uVar7;
          (*__glewBlendFuncSeparatei)
                    (local_5c,GVar4,GVar5,uVar7,
                     *(GLenum *)
                      (BlendFactor2GLBlend(Diligent::BLEND_FACTOR)::BlendFactor2GLBlendMap +
                      lVar18 * 4));
          local_54 = glGetError();
          if (local_54 != 0) {
            in_stack_ffffffffffffff68 = &local_54;
            LogError<false,char[40],char[17],unsigned_int>
                      (false,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x332,(char (*) [40])"Failed to set separate blending factors",
                       (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_ffffffffffffff68);
            FormatString<char[6]>(&local_80,(char (*) [6])0x32952e);
            pacVar11 = (char (*) [53])0x332;
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x332);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          lVar18 = (long)(char)pBVar9->RenderTargets[(long)pacVar10].SrcBlend;
          if (5 < lVar18) {
            FormatString<char[26],char[53]>
                      (&local_80,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"BlendOp < int{_countof(BlendOperation2GLBlendOpMap)}",
                       pacVar11);
            pacVar11 = (char (*) [53])0x195;
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"BlendOperation2GLBlendOp",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
                       ,0x195);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          GVar4 = *(GLenum *)
                   (BlendOperation2GLBlendOp(Diligent::BLEND_OPERATION)::BlendOperation2GLBlendOpMap
                   + lVar18 * 4);
          lVar18 = (long)(char)pBVar9->RenderTargets[(long)pacVar10].SrcBlendAlpha;
          if (5 < lVar18) {
            FormatString<char[26],char[53]>
                      (&local_80,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"BlendOp < int{_countof(BlendOperation2GLBlendOpMap)}",
                       pacVar11);
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"BlendOperation2GLBlendOp",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
                       ,0x195);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          (*__glewBlendEquationSeparatei)
                    (local_5c,GVar4,
                     *(GLenum *)
                      (BlendOperation2GLBlendOp(Diligent::BLEND_OPERATION)::
                       BlendOperation2GLBlendOpMap + lVar18 * 4));
          local_54 = glGetError();
          pBVar9 = local_50;
          if (local_54 != 0) {
            in_stack_ffffffffffffff68 = &local_54;
            LogError<false,char[42],char[17],unsigned_int>
                      (false,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x336,(char (*) [42])"Failed to set separate blending equations",
                       (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_ffffffffffffff68);
            FormatString<char[6]>(&local_80,(char (*) [6])0x32952e);
            DebugAssertionFailed
                      (local_80._M_dataplus._M_p,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x336);
LAB_00165072:
            pBVar9 = local_50;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
              pBVar9 = local_50;
            }
          }
        }
      }
      else if (LVar3 != LOGIC_OP_CLEAR) {
        FormatString<char[36],int,char[32],int,char[14]>
                  (&local_80,(Diligent *)"Blend is enabled for render target ",
                   (char (*) [36])&local_5c,(int *)" but this device only supports ",
                   (char (*) [32])local_48,(int *)" draw buffers",
                   (char (*) [14])in_stack_ffffffffffffff68);
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,local_80._M_dataplus._M_p,0,0,0);
        }
        goto LAB_00165072;
      }
      bVar16 = 6 < (int)local_5c;
      local_5c = local_5c + 1;
      if (bVar16) {
        return;
      }
    } while( true );
  }
  lVar18 = (long)(char)pBVar13->RenderTargets[0].SrcBlend;
  if (0x11 < lVar18) {
    FormatString<char[26],char[43]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"bf < int{_countof(BlendFactor2GLBlendMap)}",
               &pBVar9->AlphaToCoverageEnable);
    pBVar9 = (BlendStateDesc *)0x183;
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"BlendFactor2GLBlend",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x183);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  GVar4 = *(GLenum *)
           (BlendFactor2GLBlend(Diligent::BLEND_FACTOR)::BlendFactor2GLBlendMap + lVar18 * 4);
  lVar18 = (long)(char)pBVar13->RenderTargets[0].DestBlend;
  if (0x11 < lVar18) {
    FormatString<char[26],char[43]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"bf < int{_countof(BlendFactor2GLBlendMap)}",
               &pBVar9->AlphaToCoverageEnable);
    pBVar9 = (BlendStateDesc *)0x183;
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"BlendFactor2GLBlend",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x183);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  GVar5 = *(GLenum *)
           (BlendFactor2GLBlend(Diligent::BLEND_FACTOR)::BlendFactor2GLBlendMap + lVar18 * 4);
  lVar18 = (long)(char)pBVar13->RenderTargets[0].SrcBlendAlpha;
  if (0x11 < lVar18) {
    FormatString<char[26],char[43]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"bf < int{_countof(BlendFactor2GLBlendMap)}",
               &pBVar9->AlphaToCoverageEnable);
    pBVar9 = (BlendStateDesc *)0x183;
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"BlendFactor2GLBlend",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x183);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  GVar6 = *(GLenum *)
           (BlendFactor2GLBlend(Diligent::BLEND_FACTOR)::BlendFactor2GLBlendMap + lVar18 * 4);
  lVar18 = (long)(char)pBVar13->RenderTargets[0].DestBlendAlpha;
  if (0x11 < lVar18) {
    FormatString<char[26],char[43]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"bf < int{_countof(BlendFactor2GLBlendMap)}",
               &pBVar9->AlphaToCoverageEnable);
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"BlendFactor2GLBlend",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x183);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  pacVar11 = (char (*) [53])
             (ulong)*(uint *)(BlendFactor2GLBlend(Diligent::BLEND_FACTOR)::BlendFactor2GLBlendMap +
                             lVar18 * 4);
  (*__glewBlendFuncSeparate)
            (GVar4,GVar5,GVar6,
             *(uint *)(BlendFactor2GLBlend(Diligent::BLEND_FACTOR)::BlendFactor2GLBlendMap +
                      lVar18 * 4));
  local_5c = glGetError();
  pBVar9 = local_38;
  if (local_5c != 0) {
    LogError<false,char[31],char[17],unsigned_int>
              (false,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x348,(char (*) [31])"Failed to set blending factors",
               (char (*) [17])"\nGL Error Code: ",&local_5c);
    FormatString<char[6]>(&local_80,(char (*) [6])0x32952e);
    pacVar11 = (char (*) [53])0x348;
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  lVar18 = (long)(char)pBVar9->RenderTargets[0].BlendOp;
  if (5 < lVar18) {
    FormatString<char[26],char[53]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"BlendOp < int{_countof(BlendOperation2GLBlendOpMap)}",pacVar11);
    pacVar11 = (char (*) [53])0x195;
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"BlendOperation2GLBlendOp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x195);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  GVar4 = *(GLenum *)
           (BlendOperation2GLBlendOp(Diligent::BLEND_OPERATION)::BlendOperation2GLBlendOpMap +
           lVar18 * 4);
  lVar18 = (long)(char)pBVar9->RenderTargets[0].BlendOpAlpha;
  if (5 < lVar18) {
    FormatString<char[26],char[53]>
              (&local_80,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"BlendOp < int{_countof(BlendOperation2GLBlendOpMap)}",pacVar11);
    DebugAssertionFailed
              (local_80._M_dataplus._M_p,"BlendOperation2GLBlendOp",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLTypeConversions.hpp"
               ,0x195);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  (*__glewBlendEquationSeparate)
            (GVar4,*(GLenum *)
                    (BlendOperation2GLBlendOp(Diligent::BLEND_OPERATION)::
                     BlendOperation2GLBlendOpMap + lVar18 * 4));
  local_5c = glGetError();
  if (local_5c == 0) {
    return;
  }
  LogError<false,char[33],char[17],unsigned_int>
            (false,"SetBlendState",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
             ,0x34d,(char (*) [33])"Failed to set blending equations",
             (char (*) [17])"\nGL Error Code: ",&local_5c);
  FormatString<char[6]>(&local_80,(char (*) [6])0x32952e);
  DebugAssertionFailed
            (local_80._M_dataplus._M_p,"SetBlendState",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
             ,0x34d);
LAB_0016540d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GLContextState::SetBlendState(const BlendStateDesc& BSDsc, Uint32 RenderTargetMask, Uint32 SampleMask)
{
    if (SampleMask != 0xFFFFFFFF)
        LOG_ERROR_MESSAGE("Sample mask is not currently implemented in GL backend");

    bool       bEnableBlend               = BSDsc.RenderTargets[0].BlendEnable;
    bool       bUseIndexedColorWriteMasks = false;
    COLOR_MASK NonIndexedColorMask        = COLOR_MASK_NONE;

    if (RenderTargetMask & ~((1u << MAX_RENDER_TARGETS) - 1u))
    {
        UNEXPECTED("Render target mask (", RenderTargetMask, ") contains bits that correspond to non-existent render targets");
        RenderTargetMask &= (1u << MAX_RENDER_TARGETS) - 1u;
    }

    if (RenderTargetMask & ~((1u << m_Caps.MaxDrawBuffers) - 1u))
    {
        LOG_ERROR_MESSAGE("Render target mask (", RenderTargetMask, ") contains buffer ", PlatformMisc::GetLSB(RenderTargetMask), " but this device only supports ", m_Caps.MaxDrawBuffers, " draw buffers");
        RenderTargetMask &= (1u << m_Caps.MaxDrawBuffers) - 1u;
    }

    for (Uint32 Mask = RenderTargetMask; Mask != 0;)
    {
        Uint32 rt = PlatformMisc::GetLSB(Mask);
        Mask &= ~(1u << rt);
        VERIFY_EXPR(rt < MAX_RENDER_TARGETS && static_cast<int>(rt) < m_Caps.MaxDrawBuffers);

        const RenderTargetBlendDesc& RT = BSDsc.RenderTargets[rt];
        VERIFY(RT.RenderTargetWriteMask != COLOR_MASK_NONE, "Render target write mask should not be COLOR_MASK_NONE if corresponding bit is set in RenderTargetMask");
        if (NonIndexedColorMask == COLOR_MASK_NONE)
        {
            NonIndexedColorMask = RT.RenderTargetWriteMask;
        }
        else if (NonIndexedColorMask != RT.RenderTargetWriteMask)
        {
            bUseIndexedColorWriteMasks = true;
        }

        if (BSDsc.IndependentBlendEnable && RT.BlendEnable)
            bEnableBlend = true;
    }

    if (bUseIndexedColorWriteMasks)
    {
        for (Uint32 Mask = RenderTargetMask; Mask != 0;)
        {
            Uint32 rt = PlatformMisc::GetLSB(Mask);
            Mask &= ~(1u << rt);
            VERIFY_EXPR(rt < MAX_RENDER_TARGETS && static_cast<int>(rt) < m_Caps.MaxDrawBuffers);
            SetColorWriteMaskIndexed(rt, BSDsc.RenderTargets[rt].RenderTargetWriteMask);
        }
    }
    else if (NonIndexedColorMask != COLOR_MASK_NONE)
    {
        // If the color write mask is COLOR_MASK_NONE, the draw buffer is disabled with glDrawBuffer.
        SetColorWriteMask(NonIndexedColorMask);
    }

    if (bEnableBlend)
    {
        //  Sets the blend enable flag for ALL color buffers.
        glEnable(GL_BLEND);
        DEV_CHECK_GL_ERROR("Failed to enable alpha blending");

        if (BSDsc.AlphaToCoverageEnable)
        {
            glEnable(GL_SAMPLE_ALPHA_TO_COVERAGE);
            DEV_CHECK_GL_ERROR("Failed to enable alpha to coverage");
        }
        else
        {
            glDisable(GL_SAMPLE_ALPHA_TO_COVERAGE);
            DEV_CHECK_GL_ERROR("Failed to disable alpha to coverage");
        }

        if (BSDsc.IndependentBlendEnable)
        {
            for (int i = 0; i < static_cast<int>(MAX_RENDER_TARGETS); ++i)
            {
                const RenderTargetBlendDesc& RT = BSDsc.RenderTargets[i];

                if (i >= m_Caps.MaxDrawBuffers)
                {
                    if (RT.BlendEnable)
                        LOG_ERROR_MESSAGE("Blend is enabled for render target ", i, " but this device only supports ", m_Caps.MaxDrawBuffers, " draw buffers");
                    continue;
                }

                if (RT.BlendEnable)
                {
                    glEnablei(GL_BLEND, i);
                    DEV_CHECK_GL_ERROR("Failed to enable alpha blending");

                    GLenum srcFactorRGB   = BlendFactor2GLBlend(RT.SrcBlend);
                    GLenum dstFactorRGB   = BlendFactor2GLBlend(RT.DestBlend);
                    GLenum srcFactorAlpha = BlendFactor2GLBlend(RT.SrcBlendAlpha);
                    GLenum dstFactorAlpha = BlendFactor2GLBlend(RT.DestBlendAlpha);
                    glBlendFuncSeparatei(i, srcFactorRGB, dstFactorRGB, srcFactorAlpha, dstFactorAlpha);
                    DEV_CHECK_GL_ERROR("Failed to set separate blending factors");
                    GLenum modeRGB   = BlendOperation2GLBlendOp(RT.BlendOp);
                    GLenum modeAlpha = BlendOperation2GLBlendOp(RT.BlendOpAlpha);
                    glBlendEquationSeparatei(i, modeRGB, modeAlpha);
                    DEV_CHECK_GL_ERROR("Failed to set separate blending equations");
                }
                else
                {
                    glDisablei(GL_BLEND, i);
                    DEV_CHECK_GL_ERROR("Failed to disable alpha blending");
                }
            }
        }
        else
        {
            const RenderTargetBlendDesc& RT0 = BSDsc.RenderTargets[0];

            GLenum srcFactorRGB   = BlendFactor2GLBlend(RT0.SrcBlend);
            GLenum dstFactorRGB   = BlendFactor2GLBlend(RT0.DestBlend);
            GLenum srcFactorAlpha = BlendFactor2GLBlend(RT0.SrcBlendAlpha);
            GLenum dstFactorAlpha = BlendFactor2GLBlend(RT0.DestBlendAlpha);
            glBlendFuncSeparate(srcFactorRGB, dstFactorRGB, srcFactorAlpha, dstFactorAlpha);
            DEV_CHECK_GL_ERROR("Failed to set blending factors");

            GLenum modeRGB   = BlendOperation2GLBlendOp(RT0.BlendOp);
            GLenum modeAlpha = BlendOperation2GLBlendOp(RT0.BlendOpAlpha);
            glBlendEquationSeparate(modeRGB, modeAlpha);
            DEV_CHECK_GL_ERROR("Failed to set blending equations");
        }
    }
    else
    {
        //  Sets the blend disable flag for ALL color buffers.
        glDisable(GL_BLEND);
        DEV_CHECK_GL_ERROR("Failed to disable alpha blending");
    }
}